

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O2

Sequence * __thiscall
Sequence::subsequence(Sequence *__return_storage_ptr__,Sequence *this,int begin,int end)

{
  int iVar1;
  size_type sVar2;
  reference piVar3;
  int *piVar4;
  long lVar5;
  
  Sequence(__return_storage_ptr__,end - begin);
  lVar5 = 0;
  while( true ) {
    sVar2 = std::deque<int,_std::allocator<int>_>::size(&__return_storage_ptr__->m_bits);
    if ((int)sVar2 <= lVar5) break;
    piVar3 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                       (&(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_start,lVar5 + begin);
    iVar1 = *piVar3;
    piVar4 = operator[](__return_storage_ptr__,(int)lVar5);
    *piVar4 = iVar1;
    lVar5 = lVar5 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Sequence Sequence::subsequence(int begin, int end) {
    Sequence seq(end - begin);
    for (auto i = 0; i < seq.size(); ++i) {
        seq[i] = m_bits[begin + i];
    }
    return seq;
}